

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

FloatTextureHandle __thiscall
pbrt::FloatTextureHandle::Create
          (FloatTextureHandle *this,string *name,Transform *renderFromTexture,
          TextureParameterDictionary *parameters,FileLoc *loc,Allocator alloc,bool gpu)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int iVar17;
  uintptr_t iptr_1;
  FloatCheckerboardTexture *pFVar18;
  FloatImageTexture *pFVar19;
  FloatDotsTexture *pFVar20;
  undefined8 *puVar21;
  undefined4 extraout_var_00;
  FileLoc *loc_00;
  ulong uVar22;
  FileLoc *loc_01;
  FileLoc *loc_02;
  FileLoc *loc_03;
  FileLoc *loc_04;
  FileLoc *loc_05;
  Transform *pTVar23;
  char *fmt;
  uintptr_t iptr;
  long in_FS_OFFSET;
  undefined4 extraout_var;
  
  (this->
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  ).bits = 0;
  loc_00 = (FileLoc *)parameters;
  pTVar23 = (Transform *)name;
  iVar17 = std::__cxx11::string::compare((char *)name);
  if (iVar17 == 0) {
    pFVar18 = (FloatCheckerboardTexture *)
              FloatConstantTexture::Create(pTVar23,parameters,loc_01,alloc);
    uVar22 = 0x5000000000000;
LAB_0033371e:
    (this->
    super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
    ).bits = uVar22 | (ulong)pFVar18;
  }
  else {
    pTVar23 = (Transform *)0x2c8dc62;
    iVar17 = std::__cxx11::string::compare((char *)name);
    if (iVar17 != 0) {
      pTVar23 = (Transform *)name;
      iVar17 = std::__cxx11::string::compare((char *)name);
      if (iVar17 == 0) {
        pFVar18 = (FloatCheckerboardTexture *)
                  FloatMixTexture::Create(pTVar23,parameters,loc_02,alloc);
        uVar22 = 0x3000000000000;
      }
      else {
        iVar17 = std::__cxx11::string::compare((char *)name);
        if (iVar17 == 0) {
          pFVar18 = (FloatCheckerboardTexture *)
                    FloatBilerpTexture::Create(renderFromTexture,parameters,loc,alloc);
          uVar22 = 0x6000000000000;
        }
        else {
          iVar17 = std::__cxx11::string::compare((char *)name);
          if (iVar17 == 0) {
            if (gpu) {
              LogFatal(Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/textures.h"
                       ,0x2f0,"GPUFloatImageTexture::Create called in non-GPU configuration.");
            }
            pFVar19 = FloatImageTexture::Create(renderFromTexture,parameters,loc,alloc);
            uVar22 = (ulong)pFVar19 | 0x1000000000000;
LAB_00333654:
            (this->
            super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
            ).bits = uVar22;
            goto LAB_00333724;
          }
          iVar17 = std::__cxx11::string::compare((char *)name);
          if (iVar17 == 0) {
            pFVar18 = FloatCheckerboardTexture::Create(renderFromTexture,parameters,loc,alloc);
            uVar22 = 0x7000000000000;
          }
          else {
            iVar17 = std::__cxx11::string::compare((char *)name);
            if (iVar17 == 0) {
              pFVar20 = FloatDotsTexture::Create(renderFromTexture,parameters,loc,alloc);
              uVar22 = (ulong)pFVar20 | 0x8000000000000;
              goto LAB_00333654;
            }
            iVar17 = std::__cxx11::string::compare((char *)name);
            if (iVar17 == 0) {
              pFVar18 = (FloatCheckerboardTexture *)
                        FBmTexture::Create(renderFromTexture,parameters,loc_03,alloc);
              uVar22 = 0x9000000000000;
            }
            else {
              iVar17 = std::__cxx11::string::compare((char *)name);
              if (iVar17 == 0) {
                pFVar18 = (FloatCheckerboardTexture *)
                          WrinkledTexture::Create(renderFromTexture,parameters,loc_04,alloc);
                uVar22 = 0xc000000000000;
              }
              else {
                iVar17 = std::__cxx11::string::compare((char *)name);
                if (iVar17 == 0) {
                  uVar1 = *(undefined8 *)(renderFromTexture->mInv).m[0];
                  uVar2 = *(undefined8 *)((renderFromTexture->mInv).m[0] + 2);
                  uVar3 = *(undefined8 *)(renderFromTexture->mInv).m[1];
                  uVar4 = *(undefined8 *)((renderFromTexture->mInv).m[1] + 2);
                  uVar5 = *(undefined8 *)(renderFromTexture->mInv).m[2];
                  uVar6 = *(undefined8 *)((renderFromTexture->mInv).m[2] + 2);
                  uVar7 = *(undefined8 *)(renderFromTexture->mInv).m[3];
                  uVar8 = *(undefined8 *)((renderFromTexture->mInv).m[3] + 2);
                  uVar9 = *(undefined8 *)(renderFromTexture->m).m[0];
                  uVar10 = *(undefined8 *)((renderFromTexture->m).m[0] + 2);
                  uVar11 = *(undefined8 *)(renderFromTexture->m).m[1];
                  uVar12 = *(undefined8 *)((renderFromTexture->m).m[1] + 2);
                  uVar13 = *(undefined8 *)(renderFromTexture->m).m[2];
                  uVar14 = *(undefined8 *)((renderFromTexture->m).m[2] + 2);
                  uVar15 = *(undefined8 *)(renderFromTexture->m).m[3];
                  uVar16 = *(undefined8 *)((renderFromTexture->m).m[3] + 2);
                  iVar17 = (*(alloc.memoryResource)->_vptr_memory_resource[2])
                                     (alloc.memoryResource,0x80,4);
                  puVar21 = (undefined8 *)CONCAT44(extraout_var,iVar17);
                  *puVar21 = uVar1;
                  puVar21[1] = uVar2;
                  puVar21[2] = uVar3;
                  puVar21[3] = uVar4;
                  puVar21[4] = uVar5;
                  puVar21[5] = uVar6;
                  puVar21[6] = uVar7;
                  puVar21[7] = uVar8;
                  puVar21[8] = uVar9;
                  puVar21[9] = uVar10;
                  puVar21[10] = uVar11;
                  puVar21[0xb] = uVar12;
                  puVar21[0xc] = uVar13;
                  puVar21[0xd] = uVar14;
                  puVar21[0xe] = uVar15;
                  puVar21[0xf] = uVar16;
                  iVar17 = (*(alloc.memoryResource)->_vptr_memory_resource[2])
                                     (alloc.memoryResource,8,8);
                  pFVar18 = (FloatCheckerboardTexture *)CONCAT44(extraout_var_00,iVar17);
                  *(ulong *)&pFVar18->map2D = (ulong)puVar21 | 0x1000000000000;
                  uVar22 = 0xb000000000000;
                }
                else {
                  pTVar23 = (Transform *)name;
                  iVar17 = std::__cxx11::string::compare((char *)name);
                  if (iVar17 != 0) {
                    fmt = "%s: float texture type unknown.";
                    goto LAB_00333751;
                  }
                  if (gpu) {
                    ErrorExit(loc,"ptex texture is not supported on the GPU.");
                  }
                  pFVar18 = (FloatCheckerboardTexture *)
                            FloatPtexTexture::Create(pTVar23,parameters,loc_05,alloc);
                  uVar22 = 0xa000000000000;
                }
              }
            }
          }
        }
      }
      goto LAB_0033371e;
    }
    FloatScaledTexture::Create((FloatScaledTexture *)this,pTVar23,parameters,loc_00,alloc);
  }
LAB_00333724:
  if (((this->
       super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
       ).bits & 0xffffffffffff) != 0) {
    *(long *)(in_FS_OFFSET + -0x1b8) = *(long *)(in_FS_OFFSET + -0x1b8) + 1;
    return (FloatTextureHandle)
           (TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
            )this;
  }
  fmt = "%s: unable to create texture.";
LAB_00333751:
  ErrorExit<std::__cxx11::string_const&>(loc,fmt,name);
}

Assistant:

FloatTextureHandle FloatTextureHandle::Create(
    const std::string &name, const Transform &renderFromTexture,
    const TextureParameterDictionary &parameters, const FileLoc *loc, Allocator alloc,
    bool gpu) {
    FloatTextureHandle tex;
    if (name == "constant")
        tex = FloatConstantTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "scale")
        tex = FloatScaledTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "mix")
        tex = FloatMixTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "bilerp")
        tex = FloatBilerpTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "imagemap") {
        if (gpu)
            tex = GPUFloatImageTexture::Create(renderFromTexture, parameters, loc, alloc);
        else
            tex = FloatImageTexture::Create(renderFromTexture, parameters, loc, alloc);
    } else if (name == "checkerboard")
        tex = FloatCheckerboardTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "dots")
        tex = FloatDotsTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "fbm")
        tex = FBmTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "wrinkled")
        tex = WrinkledTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "windy")
        tex = WindyTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "ptex") {
        if (gpu)
            ErrorExit(loc, "ptex texture is not supported on the GPU.");
        else
            tex = FloatPtexTexture::Create(renderFromTexture, parameters, loc, alloc);
    } else
        ErrorExit(loc, "%s: float texture type unknown.", name);

    if (!tex)
        ErrorExit(loc, "%s: unable to create texture.", name);

    ++nTextures;

    // FIXME: reenable this once we handle all the same image texture parameters
    // CO    parameters.ReportUnused();
    return tex;
}